

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

bool __thiscall
ELFIO::elfio::write_segment_data
          (elfio *this,segment *seg,vector<bool,_std::allocator<bool>_> *section_generated,
          Elf_Xword *segment_memory,Elf_Xword *segment_filesize,Elf_Xword *seg_start_pos)

{
  section *psVar1;
  ushort uVar2;
  bool bVar3;
  bool bVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar8;
  undefined4 extraout_var_05;
  undefined8 extraout_RDX;
  byte local_f9;
  reference local_e0;
  long local_d0;
  reference local_c8;
  reference local_b8;
  ulong local_a8;
  Elf64_Off error;
  Elf_Xword align;
  ulong local_88;
  Elf64_Off cur_offset;
  Elf64_Off req_offset;
  ulong local_68;
  Elf_Xword section_align;
  section *local_50;
  section *sec;
  Elf_Half index;
  Elf_Xword *pEStack_40;
  Elf_Half j;
  Elf_Xword *seg_start_pos_local;
  Elf_Xword *segment_filesize_local;
  Elf_Xword *segment_memory_local;
  vector<bool,_std::allocator<bool>_> *section_generated_local;
  segment *seg_local;
  elfio *this_local;
  
  sec._6_2_ = 0;
  pEStack_40 = seg_start_pos;
  seg_start_pos_local = segment_filesize;
  segment_filesize_local = segment_memory;
  segment_memory_local = (Elf_Xword *)section_generated;
  section_generated_local = (vector<bool,_std::allocator<bool>_> *)seg;
  seg_local = (segment *)this;
  do {
    uVar2 = sec._6_2_;
    uVar5 = (*(code *)(section_generated_local->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[0x16])();
    if (uVar5 <= uVar2) {
      return true;
    }
    sec._4_2_ = (*(code *)(section_generated_local->super__Bvector_base<std::allocator<bool>_>).
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                          [0x17])(section_generated_local,sec._6_2_,extraout_RDX,sec._6_2_);
    local_50 = Sections::operator[](&this->sections,(uint)sec._4_2_);
    iVar6 = (*local_50->_vptr_section[5])();
    if (iVar6 == 0) {
      _section_align =
           std::vector<bool,_std::allocator<bool>_>::operator[]
                     ((vector<bool,_std::allocator<bool>_> *)segment_memory_local,(ulong)sec._4_2_);
      std::_Bit_reference::operator=((_Bit_reference *)&section_align,true);
    }
    else {
      local_68 = 0;
      _req_offset = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)segment_memory_local,
                               (ulong)sec._4_2_);
      bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&req_offset);
      bVar4 = false;
      if (!bVar3) {
        uVar7 = (*local_50->_vptr_section[0x26])();
        bVar4 = false;
        if ((uVar7 & 1) != 0) {
          iVar6 = (*local_50->_vptr_section[5])();
          bVar4 = false;
          if (iVar6 != 8) {
            iVar6 = (*local_50->_vptr_section[5])();
            bVar4 = false;
            if (iVar6 != 0) {
              iVar6 = (*local_50->_vptr_section[0x13])();
              bVar4 = CONCAT44(extraout_var,iVar6) != 0;
            }
          }
        }
      }
      if (bVar4) {
        iVar6 = (*local_50->_vptr_section[0x11])();
        lVar8 = (*(code *)(section_generated_local->super__Bvector_base<std::allocator<bool>_>).
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[9]
                )();
        cur_offset = CONCAT44(extraout_var_00,iVar6) - lVar8;
        local_88 = this->current_file_pos - *pEStack_40;
        if (cur_offset < local_88) {
          return false;
        }
        local_68 = cur_offset - local_88;
      }
      else {
        _align = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)segment_memory_local,
                            (ulong)sec._4_2_);
        bVar4 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&align);
        local_f9 = 0;
        if (!bVar4) {
          iVar6 = (*local_50->_vptr_section[0x26])();
          local_f9 = (byte)iVar6 ^ 0xff;
        }
        if ((local_f9 & 1) == 0) {
          local_b8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)segment_memory_local,
                                (ulong)sec._4_2_);
          bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_b8);
          if (bVar4) {
            iVar6 = (*local_50->_vptr_section[0x17])();
            local_68 = (CONCAT44(extraout_var_02,iVar6) - *pEStack_40) - *seg_start_pos_local;
          }
        }
        else {
          iVar6 = (*local_50->_vptr_section[0xd])();
          error = CONCAT44(extraout_var_01,iVar6);
          if (error == 0) {
            error = 1;
          }
          local_a8 = this->current_file_pos % error;
          local_68 = (error - local_a8) % error;
        }
      }
      uVar7 = (*local_50->_vptr_section[7])();
      if (((uVar7 & 2) == 2) &&
         (((uVar7 = (*local_50->_vptr_section[7])(), (uVar7 & 0x400) != 0x400 ||
           (iVar6 = (*(code *)(section_generated_local->super__Bvector_base<std::allocator<bool>_>).
                              _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                              _M_p[3])(), iVar6 == 7)) ||
          (iVar6 = (*local_50->_vptr_section[5])(), iVar6 != 8)))) {
        iVar6 = (*local_50->_vptr_section[0x13])();
        *segment_filesize_local =
             CONCAT44(extraout_var_03,iVar6) + local_68 + *segment_filesize_local;
      }
      iVar6 = (*local_50->_vptr_section[5])();
      if (iVar6 != 8) {
        iVar6 = (*local_50->_vptr_section[0x13])();
        *seg_start_pos_local = CONCAT44(extraout_var_04,iVar6) + local_68 + *seg_start_pos_local;
      }
      local_c8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)segment_memory_local,
                            (ulong)sec._4_2_);
      bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_c8);
      if (!bVar4) {
        this->current_file_pos = local_68 + this->current_file_pos;
        uVar7 = (*local_50->_vptr_section[0x26])();
        psVar1 = local_50;
        if ((uVar7 & 1) == 0) {
          lVar8 = (*(code *)(section_generated_local->super__Bvector_base<std::allocator<bool>_>).
                            _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                            [9])();
          local_d0 = (lVar8 + this->current_file_pos) - *pEStack_40;
          (*psVar1->_vptr_section[0x12])(psVar1,&local_d0);
        }
        uVar7 = (*local_50->_vptr_section[2])();
        if ((uVar7 & 0xffff) != 0) {
          (*local_50->_vptr_section[0x22])(local_50,&this->current_file_pos);
        }
        iVar6 = (*local_50->_vptr_section[5])();
        if (iVar6 != 8) {
          iVar6 = (*local_50->_vptr_section[0x13])();
          this->current_file_pos = CONCAT44(extraout_var_05,iVar6) + this->current_file_pos;
        }
        local_e0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)segment_memory_local,
                              (ulong)sec._4_2_);
        std::_Bit_reference::operator=(&local_e0,true);
      }
    }
    sec._6_2_ = sec._6_2_ + 1;
  } while( true );
}

Assistant:

bool write_segment_data( const segment*     seg,
                             std::vector<bool>& section_generated,
                             Elf_Xword&         segment_memory,
                             Elf_Xword&         segment_filesize,
                             const Elf_Xword&   seg_start_pos )
    {
        for ( Elf_Half j = 0; j < seg->get_sections_num(); ++j ) {
            Elf_Half index = seg->get_section_index_at( j );

            section* sec = sections[index];

            // The NULL section is always generated
            if ( SHT_NULL == sec->get_type() ) {
                section_generated[index] = true;
                continue;
            }

            Elf_Xword section_align = 0;
            // Fix up the alignment
            if ( !section_generated[index] && sec->is_address_initialized() &&
                 SHT_NOBITS != sec->get_type() && SHT_NULL != sec->get_type() &&
                 0 != sec->get_size() ) {
                // Align the sections based on the virtual addresses
                // when possible (this is what matters for execution)
                Elf64_Off req_offset =
                    sec->get_address() - seg->get_virtual_address();
                Elf64_Off cur_offset = current_file_pos - seg_start_pos;
                if ( req_offset < cur_offset ) {
                    // something has gone awfully wrong, abort!
                    // section_align would turn out negative, seeking backwards and overwriting previous data
                    return false;
                }
                section_align = req_offset - cur_offset;
            }
            else if ( !section_generated[index] &&
                      !sec->is_address_initialized() ) {
                // If no address has been specified then only the section
                // alignment constraint has to be matched
                Elf_Xword align = sec->get_addr_align();
                if ( align == 0 ) {
                    align = 1;
                }
                Elf64_Off error = current_file_pos % align;
                section_align   = ( align - error ) % align;
            }
            else if ( section_generated[index] ) {
                // Alignment for already generated sections
                section_align =
                    sec->get_offset() - seg_start_pos - segment_filesize;
            }

            // Determine the segment file and memory sizes
            // Special case .tbss section (NOBITS) in non TLS segment
            if ( ( ( sec->get_flags() & SHF_ALLOC ) == SHF_ALLOC ) &&
                 !( ( ( sec->get_flags() & SHF_TLS ) == SHF_TLS ) &&
                    ( seg->get_type() != PT_TLS ) &&
                    ( SHT_NOBITS == sec->get_type() ) ) ) {
                segment_memory += sec->get_size() + section_align;
            }

            if ( SHT_NOBITS != sec->get_type() ) {
                segment_filesize += sec->get_size() + section_align;
            }

            // Nothing to be done when generating nested segments
            if ( section_generated[index] ) {
                continue;
            }

            current_file_pos += section_align;

            // Set the section addresses when missing
            if ( !sec->is_address_initialized() ) {
                sec->set_address( seg->get_virtual_address() +
                                  current_file_pos - seg_start_pos );
            }

            if ( 0 != sec->get_index() ) {
                sec->set_offset( current_file_pos );
            }

            if ( SHT_NOBITS != sec->get_type() ) {
                current_file_pos += sec->get_size();
            }

            section_generated[index] = true;
        }

        return true;
    }